

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int *piVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  double *pdVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  double *pdVar33;
  uint uVar34;
  int iVar35;
  double __x;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  pdVar14 = this->gPartials[parIndex];
  pdVar15 = this->gStateFrequencies[stateFrequenciesIndex];
  pdVar16 = this->gTransitionMatrices[probIndex];
  pdVar17 = this->gTransitionMatrices[firstDerivativeIndex];
  pdVar18 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar19 = this->gTipStates[childIndex], piVar19 != (int *)0x0)) {
    iVar35 = this->kCategoryCount;
    uVar10 = this->kPatternCount;
    uVar31 = (ulong)uVar10;
    if (0 < (long)iVar35) {
      iVar11 = this->kPartialsPaddedStateCount;
      iVar12 = this->kMatrixSize;
      uVar13 = this->kStateCount;
      lVar27 = 0;
      lVar30 = 0;
      iVar23 = 0;
      do {
        if (0 < (int)uVar10) {
          lVar30 = (long)(int)lVar30;
          uVar32 = 0;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = pdVar18[lVar27];
          pdVar29 = this->integrationTmp;
          pdVar20 = this->firstDerivTmp;
          iVar24 = this->kTransPaddedStateCount;
          pdVar33 = pdVar14 + lVar30;
          iVar26 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar28 = 0;
              lVar25 = (long)piVar19[uVar32] + (long)iVar23;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar29[(long)iVar26 + uVar28];
                auVar42._8_8_ = 0;
                auVar42._0_8_ = pdVar16[lVar25] * pdVar33[uVar28];
                auVar38 = vfmadd213sd_fma(auVar42,auVar37,auVar1);
                pdVar29[(long)iVar26 + uVar28] = auVar38._0_8_;
                pdVar21 = pdVar17 + lVar25;
                lVar25 = lVar25 + iVar24;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar20[(long)iVar26 + uVar28];
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *pdVar21 * pdVar33[uVar28];
                auVar38 = vfmadd213sd_fma(auVar43,auVar37,auVar2);
                pdVar20[(long)iVar26 + uVar28] = auVar38._0_8_;
                uVar28 = uVar28 + 1;
              } while (uVar13 != uVar28);
              iVar26 = iVar26 + (int)uVar28;
            }
            lVar30 = lVar30 + iVar11;
            uVar32 = uVar32 + 1;
            pdVar33 = pdVar33 + iVar11;
          } while (uVar32 != uVar31);
        }
        iVar23 = iVar23 + iVar12;
        lVar27 = lVar27 + 1;
      } while (lVar27 != iVar35);
    }
  }
  else {
    iVar35 = this->kCategoryCount;
    uVar10 = this->kPatternCount;
    uVar31 = (ulong)uVar10;
    if (0 < (long)iVar35) {
      uVar13 = this->kStateCount;
      iVar11 = this->kMatrixSize;
      iVar23 = 0;
      lVar30 = 0;
      pdVar33 = this->gPartials[childIndex];
      lVar27 = 0;
      iVar12 = this->kPartialsPaddedStateCount;
      do {
        if (0 < (int)uVar10) {
          lVar30 = (long)(int)lVar30;
          uVar34 = 0;
          lVar25 = 0;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = pdVar18[lVar27];
          pdVar29 = pdVar33 + lVar30;
          pdVar20 = this->integrationTmp;
          pdVar21 = this->firstDerivTmp;
          do {
            if (0 < (int)uVar13) {
              lVar25 = (long)(int)lVar25;
              uVar32 = 0;
              iVar24 = iVar23;
              do {
                auVar37 = ZEXT816(0) << 0x40;
                auVar45 = ZEXT816(0) << 0x40;
                uVar28 = 0;
                do {
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = pdVar29[uVar28];
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = pdVar16[(long)iVar24 + uVar28];
                  auVar45 = vfmadd231sd_fma(auVar45,auVar50,auVar3);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar17[(long)iVar24 + uVar28];
                  auVar37 = vfmadd231sd_fma(auVar37,auVar50,auVar4);
                  uVar28 = uVar28 + 1;
                } while (uVar13 != uVar28);
                iVar24 = iVar24 + uVar13 + 1;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = pdVar20[lVar25];
                auVar48._8_8_ = 0;
                auVar48._0_8_ = auVar45._0_8_ * pdVar14[lVar30 + uVar32];
                auVar45 = vfmadd213sd_fma(auVar48,auVar38,auVar5);
                pdVar20[lVar25] = auVar45._0_8_;
                lVar22 = lVar30 + uVar32;
                uVar32 = uVar32 + 1;
                auVar45._8_8_ = 0;
                auVar45._0_8_ = pdVar21[lVar25];
                auVar44._8_8_ = 0;
                auVar44._0_8_ = auVar37._0_8_ * pdVar14[lVar22];
                auVar45 = vfmadd213sd_fma(auVar44,auVar38,auVar45);
                pdVar21[lVar25] = auVar45._0_8_;
                lVar25 = lVar25 + 1;
              } while (uVar32 != uVar13);
            }
            lVar30 = lVar30 + iVar12;
            pdVar29 = pdVar29 + iVar12;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar10);
        }
        lVar27 = lVar27 + 1;
        iVar23 = iVar23 + iVar11;
      } while (lVar27 != iVar35);
    }
  }
  if (0 < (int)uVar31) {
    lVar27 = 0;
    iVar35 = 0;
    do {
      iVar11 = this->kStateCount;
      if ((long)iVar11 < 1) {
        __x = 0.0;
        dVar41 = 0.0;
      }
      else {
        auVar45 = ZEXT816(0);
        auVar38 = ZEXT816(0);
        lVar30 = 0;
        do {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = pdVar15[lVar30];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = this->integrationTmp[iVar35 + lVar30];
          auVar38 = vfmadd231sd_fma(auVar38,auVar49,auVar6);
          __x = auVar38._0_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = this->firstDerivTmp[iVar35 + lVar30];
          auVar45 = vfmadd231sd_fma(auVar45,auVar49,auVar7);
          dVar41 = auVar45._0_8_;
          lVar30 = lVar30 + 1;
        } while (iVar11 != lVar30);
        iVar35 = iVar35 + iVar11;
      }
      dVar36 = log(__x);
      this->outLogLikelihoodsTmp[lVar27] = dVar36;
      this->outFirstDerivativesTmp[lVar27] = dVar41 / __x;
      lVar27 = lVar27 + 1;
      uVar31 = (ulong)this->kPatternCount;
    } while (lVar27 < (long)uVar31);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar31 < 1) {
      *outSumLogLikelihood = 0.0;
      *outSumFirstDerivative = 0.0;
      goto LAB_00128111;
    }
    uVar32 = 0;
    pdVar14 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar15 = this->outLogLikelihoodsTmp;
    do {
      pdVar15[uVar32] = pdVar14[uVar32] + pdVar15[uVar32];
      uVar32 = uVar32 + 1;
    } while ((uVar31 & 0xffffffff) != uVar32);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  if (0 < (int)uVar31) {
    pdVar14 = this->gPatternWeights;
    pdVar15 = this->outLogLikelihoodsTmp;
    pdVar16 = this->outFirstDerivativesTmp;
    uVar32 = 0;
    do {
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pdVar15[uVar32];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar14[uVar32];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *outSumLogLikelihood;
      auVar38 = vfmadd213sd_fma(auVar46,auVar39,auVar8);
      *outSumLogLikelihood = auVar38._0_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = pdVar16[uVar32];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar14[uVar32];
      uVar32 = uVar32 + 1;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *outSumFirstDerivative;
      auVar38 = vfmadd213sd_fma(auVar47,auVar40,auVar9);
      *outSumFirstDerivative = auVar38._0_8_;
    } while ((uVar31 & 0xffffffff) != uVar32);
  }
LAB_00128111:
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}